

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdEmuEmuD3D0TexFilter::emulate_mthd(MthdEmuEmuD3D0TexFilter *this)

{
  pgraph_state *state;
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  uint val;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_celsius_pre_icmd(state);
  if (((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource & 2) == 0) {
    uVar3 = (uint)((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x28) >> 0x34);
    uVar2 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_filter[1];
    val = uVar3 & 0x1ff0 |
          (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_filter[0] &
          0xffffe000;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_filter[0] = val;
    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_tex_filter[1] =
         uVar3 & 0x1ff0 | uVar2 & 0xffffe000;
    pgraph_celsius_icmd(state,0xe,val,false);
    pgraph_celsius_icmd(state,0xf,
                        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                        bundle_tex_filter[1],true);
  }
  pbVar1 = (byte *)((long)(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid + 6)
  ;
  *pbVar1 = *pbVar1 | 0x81;
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_celsius_pre_icmd(&exp);
		if (!extr(exp.nsource, 1, 1)) {
			insrt(exp.bundle_tex_filter[0], 0, 13, extrs(val, 16, 8) << 4);
			insrt(exp.bundle_tex_filter[1], 0, 13, extrs(val, 16, 8) << 4);
			pgraph_celsius_icmd(&exp, 0xe, exp.bundle_tex_filter[0], false);
			pgraph_celsius_icmd(&exp, 0xf, exp.bundle_tex_filter[1], true);
		}
		insrt(exp.valid[1], 23, 1, 1);
		insrt(exp.valid[1], 16, 1, 1);
	}